

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void update_mem_availability(gen_ctx_t gen_ctx,bitmap_t mem_av,bb_insn_t_conflict mem_bb_insn)

{
  char cVar1;
  MIR_insn_t pMVar2;
  VARR_mem_expr_t *pVVar3;
  MIR_context_t ctx;
  FILE *__stream;
  byte bVar4;
  int iVar5;
  MIR_type_t tp;
  char *pcVar6;
  char *pcVar7;
  int in_ECX;
  ulong uVar8;
  ulong *extraout_RDX;
  ulong uVar9;
  ulong uVar10;
  long in_R8;
  MIR_insn_t mem2;
  uint uVar11;
  ulong uVar12;
  
  pMVar2 = mem_bb_insn->insn;
  if ((*(uint *)&pMVar2->field_0x18 & 0xfffffffc) != 0) {
LAB_001652b2:
    __assert_fail("move_code_p (mem_bb_insn->insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xda9,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
  }
  cVar1 = pMVar2->ops[0].field_0x8;
  mem2 = (MIR_insn_t)pMVar2->ops;
  if (cVar1 != '\v') {
    mem2 = pMVar2 + 1;
  }
  if (*(char *)&(mem2->insn_link).prev != '\v') {
    __assert_fail("mem_ref->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xdab,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
  }
  if (mem_av == (bitmap_t)0x0) {
    update_mem_availability_cold_2();
    if ((extraout_RDX != (ulong *)0x0) && (*extraout_RDX != 0)) {
      ctx = gen_ctx->ctx;
      uVar9 = 0;
      do {
        if (*(long *)(extraout_RDX[2] + uVar9 * 8) != 0) {
          fputs((char *)mem_av,(FILE *)gen_ctx->debug_file);
          uVar9 = *extraout_RDX;
          if (uVar9 != 0) {
            uVar8 = 0;
            uVar12 = 0;
            do {
              while ((uVar10 = *(ulong *)(extraout_RDX[2] + uVar8 * 8), uVar10 == 0 ||
                     (uVar10 = uVar10 >> (uVar12 & 0x3f), uVar10 == 0))) {
                uVar8 = uVar8 + 1;
                uVar12 = uVar8 * 0x40;
                if (uVar9 == uVar8) goto LAB_00165478;
              }
              uVar9 = uVar10 & 1;
              while (uVar9 == 0) {
                uVar12 = uVar12 + 1;
                uVar9 = uVar10 & 2;
                uVar10 = uVar10 >> 1;
              }
              fprintf((FILE *)gen_ctx->debug_file," %3lu",uVar12);
              if ((in_ECX != 0) && (in_R8 != 0 || 0x21 < uVar12)) {
                if (in_R8 == 0) {
                  uVar11 = (uint)uVar12;
                }
                else {
                  uVar11 = *(uint *)(in_R8 + uVar12 * 4);
                }
                if (uVar11 < 0x21) {
                  __assert_fail("reg >= ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x535,
                                "void output_bitmap(gen_ctx_t, const char *, bitmap_t, int, MIR_reg_t *)"
                               );
                }
                __stream = (FILE *)gen_ctx->debug_file;
                tp = MIR_reg_type(ctx,uVar11 - 0x21,(gen_ctx->curr_func_item->u).func);
                pcVar6 = MIR_type_str(ctx,tp);
                pcVar7 = MIR_reg_name(ctx,uVar11 - 0x21,(gen_ctx->curr_func_item->u).func);
                fprintf(__stream,"(%s:%s)",pcVar6,pcVar7);
              }
              uVar9 = *extraout_RDX;
              uVar12 = uVar12 + 1;
              uVar8 = uVar12 >> 6;
            } while (uVar8 < uVar9);
          }
LAB_00165478:
          fputc(10,(FILE *)gen_ctx->debug_file);
          return;
        }
        uVar9 = uVar9 + 1;
      } while (*extraout_RDX != uVar9);
    }
    return;
  }
  uVar9 = mem_av->els_num;
  if (uVar9 != 0) {
    uVar8 = 0;
    uVar12 = 0;
    do {
      while ((mem_av->varr[uVar8] == 0 ||
             (uVar10 = mem_av->varr[uVar8] >> (uVar12 & 0x3f), uVar10 == 0))) {
        uVar8 = uVar8 + 1;
        uVar12 = uVar8 * 0x40;
        if (uVar9 == uVar8) goto LAB_00165276;
      }
      uVar9 = uVar10 & 1;
      while (uVar9 == 0) {
        uVar12 = uVar12 + 1;
        uVar9 = uVar10 & 2;
        uVar10 = uVar10 >> 1;
      }
      pVVar3 = gen_ctx->gvn_ctx->mem_exprs;
      if (((pVVar3 == (VARR_mem_expr_t *)0x0) || (pVVar3->varr == (mem_expr_t *)0x0)) ||
         (pVVar3->els_num <= uVar12)) {
        update_mem_availability_cold_1();
        goto LAB_001652b2;
      }
      if (((cVar1 == '\v') &&
          (pMVar2 = pVVar3->varr[uVar12]->insn,
          iVar5 = may_mem_alias_p((MIR_op_t *)
                                  ((long)&pMVar2->ops[0].data +
                                  (ulong)((uint)(pMVar2->ops[0].field_0x8 != '\v') * 0x30)),
                                  (MIR_op_t *)mem2), iVar5 != 0)) && (uVar12 < mem_av->els_num << 6)
         ) {
        bVar4 = (byte)uVar12 & 0x3f;
        mem_av->varr[uVar12 >> 6] =
             mem_av->varr[uVar12 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar9 = mem_av->els_num;
      uVar12 = uVar12 + 1;
      uVar8 = uVar12 >> 6;
    } while (uVar8 < uVar9);
  }
LAB_00165276:
  uVar11 = mem_bb_insn->mem_index;
  bitmap_expand(mem_av,(ulong)uVar11 + 1);
  mem_av->varr[uVar11 >> 6] = mem_av->varr[uVar11 >> 6] | 1L << ((ulong)uVar11 & 0x3f);
  return;
}

Assistant:

static void update_mem_availability (gen_ctx_t gen_ctx, bitmap_t mem_av, bb_insn_t mem_bb_insn) {
  size_t nel;
  bitmap_iterator_t bi;
  MIR_insn_t mem_insn;
  MIR_op_t *mem_ref = &mem_bb_insn->insn->ops[0];
  int ld_p;

  gen_assert (move_code_p (mem_bb_insn->insn->code));
  if ((ld_p = mem_ref->mode != MIR_OP_VAR_MEM)) mem_ref = &mem_bb_insn->insn->ops[1];
  gen_assert (mem_ref->mode == MIR_OP_VAR_MEM);
  FOREACH_BITMAP_BIT (bi, mem_av, nel) {
    mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
    if (!ld_p
        && may_mem_alias_p (&mem_insn->ops[mem_insn->ops[0].mode == MIR_OP_VAR_MEM ? 0 : 1],
                            mem_ref))
      bitmap_clear_bit_p (mem_av, nel);
  }
  bitmap_set_bit_p (mem_av, mem_bb_insn->mem_index);
}